

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_x_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint16_t *local_50;
  
  bVar1 = (byte)conv_params->round_0;
  uVar3 = 0;
  if (w < 1) {
    w = uVar3;
  }
  local_50 = dst;
  if (h < 1) {
    h = uVar3;
  }
  for (; uVar3 != h; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; (uint)w != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = clip_pixel_highbd(((int)(((uint)src[uVar4 + 1] + (uint)src[uVar4]) * 0x40 +
                                      ((1 << (bVar1 & 0x1f)) >> 1)) >> (bVar1 & 0x1f)) +
                                ((1 << (7 - bVar1 & 0x1f)) >> 1) >> (7 - bVar1 & 0x1f),bd);
      local_50[uVar4] = uVar2;
    }
    local_50 = local_50 + dst_stride;
    src = src + src_stride;
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  const int bits = FILTER_BITS - conv_params->round_0;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(filter_params_x->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 64 * (src[x] + src[x + 1]);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src += src_stride;
    dst += dst_stride;
  }
}